

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gridtestTestFunctions.cpp
# Opt level: O1

void __thiscall Two3KExpSinCos::eval(Two3KExpSinCos *this,double *x,double *y)

{
  int i;
  long lVar1;
  double dVar2;
  
  lVar1 = 0;
  do {
    dVar2 = exp(*x + x[1]);
    y[lVar1] = dVar2;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x401);
  lVar1 = 0;
  do {
    dVar2 = sin(*x + x[1]);
    y[lVar1 + 0x401] = dVar2 + 1.0;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x406);
  lVar1 = 0;
  do {
    dVar2 = cos(*x * 3.0 + x[1]);
    y[lVar1 + 0x807] = dVar2;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x3f9);
  return;
}

Assistant:

void Two3KExpSinCos::eval(const double x[], double y[]) const{
    for(int i=0; i<1025; i++){
        y[i] = std::exp(x[0] + x[1]);
    }
    for(int i=1025; i<2055; i++){
        y[i] = std::sin(x[0] + x[1]) + 1.0;
    }
    for(int i=2055; i<3072; i++){
        y[i] = std::cos(3.0*x[0] + x[1]);
    }
}